

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringBuffer_resetWriteLimit_Test::testBody
          (TEST_SimpleStringBuffer_resetWriteLimit_Test *this)

{
  char *pcVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  undefined1 local_1058 [8];
  SimpleString str;
  SimpleString local_1038;
  int local_1024;
  undefined1 local_1020 [4];
  int i;
  SimpleStringBuffer buffer;
  TEST_SimpleStringBuffer_resetWriteLimit_Test *this_local;
  
  buffer.write_limit_ = (size_t)this;
  SimpleStringBuffer::SimpleStringBuffer((SimpleStringBuffer *)local_1020);
  SimpleStringBuffer::setWriteLimit((SimpleStringBuffer *)local_1020,10);
  for (local_1024 = 0; local_1024 < 0x1000; local_1024 = local_1024 + 1) {
    SimpleStringBuffer::add((SimpleStringBuffer *)local_1020,"h");
  }
  SimpleStringBuffer::resetWriteLimit((SimpleStringBuffer *)local_1020);
  SimpleString::SimpleString(&local_1038,"h",10);
  pcVar1 = SimpleString::asCharString(&local_1038);
  SimpleStringBuffer::add((SimpleStringBuffer *)local_1020,"%s",pcVar1);
  SimpleString::~SimpleString(&local_1038);
  SimpleString::SimpleString((SimpleString *)local_1058,"h",0x14);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString((SimpleString *)local_1058);
  pcVar3 = SimpleStringBuffer::toString((SimpleStringBuffer *)local_1020);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,pcVar1,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x26d,pTVar4);
  SimpleString::~SimpleString((SimpleString *)local_1058);
  return;
}

Assistant:

TEST(SimpleStringBuffer, resetWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    buffer.resetWriteLimit();
    buffer.add("%s", SimpleString("h", 10).asCharString());

    SimpleString str("h", 20);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}